

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

void __thiscall
Patch::Node::write_dot_graph
          (Node *this,stringstream *result,Point left_ancestor_old_end,Point left_ancestor_new_end)

{
  Node *pNVar1;
  ostream *poVar2;
  char *pcVar3;
  ostream *poVar4;
  Point node_new_end;
  Point node_old_end;
  Point node_new_start;
  Point node_old_start;
  Point local_60;
  Point local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  local_50 = left_ancestor_new_end;
  local_48 = left_ancestor_old_end;
  local_38 = Point::traverse(&local_48,&this->old_distance_from_left_ancestor);
  local_40 = Point::traverse(&local_50,&this->new_distance_from_left_ancestor);
  local_58 = Point::traverse(&local_38,&this->old_extent);
  local_60 = Point::traverse(&local_40,&this->new_extent);
  poVar4 = (ostream *)(result + 0x10);
  poVar2 = std::operator<<(poVar4,"node_");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2," [");
  poVar2 = std::operator<<(poVar2,"label=\"");
  poVar2 = std::operator<<(poVar2,"new range: ");
  poVar2 = operator<<(poVar2,&local_40);
  poVar2 = std::operator<<(poVar2," - ");
  poVar2 = operator<<(poVar2,&local_60);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"old range: ");
  poVar2 = operator<<(poVar2,&local_38);
  poVar2 = std::operator<<(poVar2," - ");
  poVar2 = operator<<(poVar2,&local_58);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar2,"new text: ");
  if ((this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl == (Text *)0x0) {
    pcVar3 = "null";
    poVar2 = poVar4;
  }
  else {
    poVar2 = std::operator<<(poVar4,"\\\"");
    poVar2 = operator<<(poVar2,(this->new_text)._M_t.
                               super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
                               super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                               super__Head_base<0UL,_Text_*,_false>._M_head_impl);
    pcVar3 = "\\\"";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar4,"old text: ");
  if ((this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl == (Text *)0x0) {
    poVar2 = std::operator<<(poVar4,"null");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar4,"old text size:");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  else {
    poVar2 = std::operator<<(poVar4,"\\\"");
    poVar2 = operator<<(poVar2,(this->old_text)._M_t.
                               super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
                               super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                               super__Head_base<0UL,_Text_*,_false>._M_head_impl);
    poVar2 = std::operator<<(poVar2,"\\\"");
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar4,"old_subtree_text_size: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar4,"new_subtree_text_size: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar4,"\"");
  poVar2 = std::operator<<(poVar2,"tooltip=\"");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2,"\"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar4,"node_");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::operator<<(poVar2," -> ");
  pNVar1 = this->left;
  poVar2 = std::operator<<(poVar4,"node_");
  if (pNVar1 == (Node *)0x0) {
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    poVar2 = std::operator<<(poVar2,"_left_null");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar4,"node_");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    poVar2 = std::operator<<(poVar2,"_left_null [label=\"\" shape=point]");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    write_dot_graph(this->left,result,local_48,local_50);
  }
  poVar2 = std::operator<<(poVar4,"node_");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::operator<<(poVar2," -> ");
  pNVar1 = this->right;
  poVar2 = std::operator<<(poVar4,"node_");
  if (pNVar1 == (Node *)0x0) {
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    poVar2 = std::operator<<(poVar2,"_right_null");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar4,"node_");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    poVar2 = std::operator<<(poVar2,"_right_null [label=\"\" shape=point]");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    write_dot_graph(this->right,result,local_58,local_60);
  }
  return;
}

Assistant:

void write_dot_graph(std::stringstream &result, Point left_ancestor_old_end, Point left_ancestor_new_end) {
    Point node_old_start = left_ancestor_old_end.traverse(old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_new_end.traverse(new_distance_from_left_ancestor);
    Point node_old_end = node_old_start.traverse(old_extent);
    Point node_new_end = node_new_start.traverse(new_extent);

    result << "node_" << this << " ["
      << "label=\""
      << "new range: " << node_new_start << " - " << node_new_end << ", " << endl
      << "old range: " << node_old_start << " - " << node_old_end << ", " << endl
      << "new text: ";

    if (new_text) {
      result << "\\\"" << *new_text << "\\\"" << endl;
    } else {
      result << "null" << endl;
    }

    result << "old text: ";
    if (old_text) {
      result << "\\\"" << *old_text <<  "\\\""  << endl;
    } else {
      result << "null" << endl;
      result << "old text size:" << old_text_size_ << endl;
    }

    result << "old_subtree_text_size: " << old_subtree_text_size << endl;
    result << "new_subtree_text_size: " << new_subtree_text_size << endl;

    result << "\""
      << "tooltip=\"" << this
      << "\"]" << endl;

    result << "node_" << this << " -> ";
    if (left) {
      result << "node_" << left << endl;
      left->write_dot_graph(result, left_ancestor_old_end, left_ancestor_new_end);
    } else {
      result << "node_" << this << "_left_null" << endl;
      result << "node_" << this << "_left_null [label=\"\" shape=point]" << endl;
    }

    result << "node_" << this << " -> ";
    if (right) {
      result << "node_" << right << endl;
      right->write_dot_graph(result, node_old_end, node_new_end);
    } else {
      result << "node_" << this << "_right_null" << endl;
      result << "node_" << this << "_right_null [label=\"\" shape=point]" << endl;
    }
  }